

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyAccelerationStructure
          (VulkanCommandBuffer *this,VkCopyAccelerationStructureInfoKHR *Info)

{
  Char *Message;
  char (*in_RCX) [32];
  undefined1 local_38 [8];
  string msg;
  VkCopyAccelerationStructureInfoKHR *Info_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = Info;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CopyAccelerationStructure",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x2af);
    std::__cxx11::string::~string((string *)local_38);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdCopyAccelerationStructureKHR)
            (this->m_VkCmdBuffer,(VkCopyAccelerationStructureInfoKHR *)msg.field_2._8_8_);
  return;
}

Assistant:

__forceinline void CopyAccelerationStructure(const VkCopyAccelerationStructureInfoKHR& Info)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy AS operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyAccelerationStructureKHR(m_VkCmdBuffer, &Info);
#else
        UNSUPPORTED("Ray tracing is not supported when vulkan library is linked statically");
#endif
    }